

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb.cc
# Opt level: O0

size_t CB_EVAL::read_cached_label(shared_data *sd,void *v,io_buf *cache)

{
  io_buf *piVar1;
  shared_data *in_RSI;
  char **in_RDI;
  size_t total;
  char *c;
  label *ld;
  io_buf *cache_00;
  undefined4 *in_stack_ffffffffffffffd0;
  io_buf *in_stack_fffffffffffffff8;
  size_t sVar2;
  
  cache_00 = (io_buf *)0x4;
  piVar1 = (io_buf *)io_buf::buf_read(in_stack_fffffffffffffff8,in_RDI,(size_t)in_RSI);
  if (piVar1 < cache_00) {
    sVar2 = 0;
  }
  else {
    *(undefined4 *)&in_RSI->queries = *in_stack_ffffffffffffffd0;
    sVar2 = CB::read_cached_label(in_RSI,in_stack_ffffffffffffffd0,cache_00);
    sVar2 = (long)&cache_00->_vptr_io_buf + sVar2;
  }
  return sVar2;
}

Assistant:

size_t read_cached_label(shared_data* sd, void* v, io_buf& cache)
{
  CB_EVAL::label* ld = (CB_EVAL::label*)v;
  char* c;
  size_t total = sizeof(uint32_t);
  if (cache.buf_read(c, total) < total)
    return 0;
  ld->action = *(uint32_t*)c;

  return total + CB::read_cached_label(sd, &(ld->event), cache);
}